

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_profile.c
# Opt level: O2

char * nextVis(char *ptr,char *cont)

{
  char cVar1;
  char cVar2;
  ushort **ppuVar3;
  
  if (cont == (char *)0x0) {
    cVar1 = *ptr;
    if ((long)cVar1 == 0) {
      return ptr;
    }
    ppuVar3 = __ctype_b_loc();
    if (cVar1 == ':') goto LAB_00109890;
    if (((*ppuVar3)[cVar1] & 0x2000) != 0) goto LAB_00109890;
  }
  else {
    do {
      cVar1 = *cont;
      if (cVar1 == '\0') {
LAB_00109893:
        while( true ) {
          cVar1 = *ptr;
          if ((long)cVar1 == 0) {
            return ptr;
          }
          ppuVar3 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0) break;
LAB_00109890:
          ptr = ptr + 1;
        }
        if (cVar1 != ':') {
          return ptr;
        }
        do {
          ptr = ptr + 1;
          if ((long)*ptr == 0) {
            return ptr;
          }
        } while ((*(byte *)((long)*ppuVar3 + (long)*ptr * 2 + 1) & 0x20) != 0);
        return ptr;
      }
      cVar2 = *ptr;
      if ((((long)cVar2 == 0) || (ppuVar3 = __ctype_b_loc(), cVar2 == ':')) ||
         (((*ppuVar3)[cVar2] & 0x2000) != 0)) goto LAB_00109893;
      ptr = ptr + 1;
      cont = cont + 1;
    } while (cVar2 == cVar1);
  }
  return (char *)0x0;
}

Assistant:

static const char *nextVis(const char *ptr, const char *cont)
{
	if (cont) {
		while (*cont) {
			if (!*ptr || (isspace(*ptr) || *ptr == ':')) {
				break;
			}
			if (*ptr++ != *cont++) {
				return 0;
			}
		}
	}
	else {
		if (!*ptr) {
			return ptr;
		}
		if (!isspace(*ptr) && *ptr != ':') {
			return 0;
		}
		++ptr;
	}
	while (*ptr && isspace(*ptr)) ++ptr;
	if (*ptr && *ptr == ':') {
		++ptr;
		while (*ptr && isspace(*ptr)) ++ptr;
	}
	return ptr;
}